

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::verifyUniformValue1i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x)

{
  int location_00 [1];
  bool bVar1;
  qpTestResult qVar2;
  int (*paiVar3) [1];
  TestLog *this;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b0;
  undefined1 local_30 [8];
  StateQueryMemoryWriteGuard<int[1]> state;
  GLint x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_value[0] = x;
  state.m_postguard[0] = location;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[1]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[1]> *)local_30);
  location_00[0] = state.m_postguard[0];
  paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_30);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location_00[0],*paiVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[1]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[1]> *)local_30,testCtx);
  if ((bVar1) &&
     (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_30),
     (*paiVar3)[0] != state.m_value[0])) {
    this = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1b0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [21])"// ERROR: expected [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_value);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_30);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue1i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[1]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x
		<< "]; got ["
		<< state[0]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}